

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hpp
# Opt level: O2

bool __thiscall
nlohmann::detail::
binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
::get_ubjson_value(binary_reader<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_ert::JsonSaxConsumer>
                   *this,char_int_type prefix)

{
  size_t sVar1;
  float fVar2;
  bool bVar3;
  int iVar4;
  _func_int *UNRECOVERED_JUMPTABLE;
  undefined1 uVar5;
  _Alloc_hider _Var6;
  undefined8 uVar7;
  json_sax_t *pjVar8;
  string *this_00;
  allocator<char> local_d1;
  string_t s;
  string last_token;
  string local_80;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  switch(prefix) {
  case 0x43:
    get(this);
    bVar3 = unexpect_eof(this,ubjson,"char");
    if (!bVar3) {
      return false;
    }
    if (this->current < 0x80) {
      s._M_dataplus._M_p = (pointer)&s.field_2;
      std::__cxx11::string::_M_construct((ulong)&s,'\x01');
      iVar4 = (*(this->sax->super_json_sax_t)._vptr_json_sax[5])(this->sax,&s);
      uVar5 = (undefined1)iVar4;
      break;
    }
    get_token_string(&last_token,this);
    sVar1 = this->chars_read;
    pjVar8 = this->sax;
    std::operator+(&local_40,"byte after \'C\' must be in range 0x00..0x7F; last byte: 0x",
                   &last_token);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"char",&local_d1);
    exception_message(&local_80,this,ubjson,&local_40,&local_60);
    parse_error::create((parse_error *)&s,0x71,sVar1,&local_80);
    iVar4 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[0xc])(pjVar8,sVar1,&last_token,&s);
    uVar5 = (undefined1)iVar4;
    goto LAB_0010ab96;
  case 0x44:
    last_token._M_dataplus._M_p = (pointer)0x0;
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<double,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(double *)&last_token);
    _Var6 = last_token._M_dataplus;
    if (!bVar3) {
      return false;
    }
    pjVar8 = this->sax;
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"",(allocator<char> *)&local_80)
    ;
    iVar4 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[4])(_Var6._M_p,pjVar8,&s);
    uVar5 = (undefined1)iVar4;
    break;
  case 0x45:
  case 0x47:
  case 0x4a:
  case 0x4b:
  case 0x4d:
  case 0x4e:
  case 0x4f:
  case 0x50:
  case 0x51:
  case 0x52:
  case 0x56:
  case 0x57:
  case 0x58:
  case 0x59:
switchD_0010aa61_caseD_45:
    get_token_string(&last_token,this);
    sVar1 = this->chars_read;
    pjVar8 = this->sax;
    std::operator+(&local_40,"invalid byte: 0x",&last_token);
    std::__cxx11::string::string<std::allocator<char>>((string *)&local_60,"value",&local_d1);
    exception_message(&local_80,this,ubjson,&local_40,&local_60);
    parse_error::create((parse_error *)&s,0x70,sVar1,&local_80);
    iVar4 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[0xc])(pjVar8,sVar1,&last_token,&s);
    uVar5 = (undefined1)iVar4;
LAB_0010ab96:
    exception::~exception((exception *)&s);
    std::__cxx11::string::~string((string *)&local_80);
    std::__cxx11::string::~string((string *)&local_60);
    std::__cxx11::string::~string((string *)&local_40);
    this_00 = &last_token;
    goto LAB_0010ae02;
  case 0x46:
    pjVar8 = this->sax;
    UNRECOVERED_JUMPTABLE = (pjVar8->super_json_sax_t)._vptr_json_sax[1];
    uVar7 = 0;
    goto LAB_0010ace5;
  case 0x48:
    bVar3 = get_ubjson_high_precision_number(this);
    return bVar3;
  case 0x49:
    s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffffffff0000;
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<short,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(short *)&s);
    if (!bVar3) {
      return false;
    }
    pjVar8 = this->sax;
    _Var6._M_p = (pointer)(long)(short)s._M_dataplus._M_p;
    goto LAB_0010ada0;
  case 0x4c:
    s._M_dataplus._M_p = (pointer)0x0;
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<long,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(long *)&s);
    if (!bVar3) {
      return false;
    }
    pjVar8 = this->sax;
    _Var6 = s._M_dataplus;
LAB_0010ada0:
    iVar4 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[2])(pjVar8,_Var6._M_p);
    return (bool)(char)iVar4;
  case 0x53:
    s._M_dataplus._M_p = (pointer)&s.field_2;
    s._M_string_length = 0;
    s.field_2._M_local_buf[0] = '\0';
    bVar3 = get_ubjson_string(this,&s,true);
    if (bVar3) {
      iVar4 = (*(this->sax->super_json_sax_t)._vptr_json_sax[5])(this->sax,&s);
      uVar5 = (undefined1)iVar4;
    }
    else {
      uVar5 = 0;
    }
    break;
  case 0x54:
    pjVar8 = this->sax;
    UNRECOVERED_JUMPTABLE = (pjVar8->super_json_sax_t)._vptr_json_sax[1];
    uVar7 = 1;
LAB_0010ace5:
    iVar4 = (*UNRECOVERED_JUMPTABLE)(pjVar8,uVar7);
    return SUB41(iVar4,0);
  case 0x55:
    s._M_dataplus._M_p = (pointer)((ulong)s._M_dataplus._M_p._1_7_ << 8);
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<unsigned_char,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(uchar *)&s);
    if (!bVar3) {
      return false;
    }
    iVar4 = (*(this->sax->super_json_sax_t)._vptr_json_sax[3])
                      (this->sax,(ulong)s._M_dataplus._M_p & 0xff);
    return (bool)(char)iVar4;
  case 0x5a:
    iVar4 = (**(this->sax->super_json_sax_t)._vptr_json_sax)();
    return SUB41(iVar4,0);
  case 0x5b:
    bVar3 = get_ubjson_array(this);
    return bVar3;
  default:
    if (prefix == 0x7b) {
      bVar3 = get_ubjson_object(this);
      return bVar3;
    }
    if (prefix != 100) {
      if (prefix == 0x69) {
        s._M_dataplus._M_p = (pointer)((ulong)s._M_dataplus._M_p._1_7_ << 8);
        bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                ::get_number<signed_char,false>
                          ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                            *)this,ubjson,(char *)&s);
        if (!bVar3) {
          return false;
        }
        pjVar8 = this->sax;
        _Var6._M_p = (pointer)(long)(char)s._M_dataplus._M_p;
        goto LAB_0010ada0;
      }
      if (prefix == 0x6c) {
        s._M_dataplus._M_p = s._M_dataplus._M_p & 0xffffffff00000000;
        bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                ::get_number<int,false>
                          ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                            *)this,ubjson,(int *)&s);
        if (!bVar3) {
          return false;
        }
        pjVar8 = this->sax;
        _Var6._M_p = (pointer)(long)(int)s._M_dataplus._M_p;
        goto LAB_0010ada0;
      }
      if (prefix == -1) {
        bVar3 = unexpect_eof(this,ubjson,"value");
        return bVar3;
      }
      goto switchD_0010aa61_caseD_45;
    }
    last_token._M_dataplus._M_p = last_token._M_dataplus._M_p & 0xffffffff00000000;
    bVar3 = binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
            ::get_number<float,false>
                      ((binary_reader<nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>,nlohmann::detail::iterator_input_adapter<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>,ert::JsonSaxConsumer>
                        *)this,ubjson,(float *)&last_token);
    if (!bVar3) {
      return false;
    }
    pjVar8 = this->sax;
    fVar2 = last_token._M_dataplus._M_p._0_4_;
    std::__cxx11::string::string<std::allocator<char>>((string *)&s,"",(allocator<char> *)&local_80)
    ;
    iVar4 = (*(pjVar8->super_json_sax_t)._vptr_json_sax[4])((double)fVar2,pjVar8,&s);
    uVar5 = (undefined1)iVar4;
  }
  this_00 = &s;
LAB_0010ae02:
  std::__cxx11::string::~string((string *)this_00);
  return (bool)uVar5;
}

Assistant:

bool get_ubjson_value(const char_int_type prefix)
    {
        switch (prefix)
        {
            case std::char_traits<char_type>::eof():  // EOF
                return unexpect_eof(input_format_t::ubjson, "value");

            case 'T':  // true
                return sax->boolean(true);
            case 'F':  // false
                return sax->boolean(false);

            case 'Z':  // null
                return sax->null();

            case 'U':
            {
                std::uint8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_unsigned(number);
            }

            case 'i':
            {
                std::int8_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'I':
            {
                std::int16_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'l':
            {
                std::int32_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'L':
            {
                std::int64_t number{};
                return get_number(input_format_t::ubjson, number) && sax->number_integer(number);
            }

            case 'd':
            {
                float number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'D':
            {
                double number{};
                return get_number(input_format_t::ubjson, number) && sax->number_float(static_cast<number_float_t>(number), "");
            }

            case 'H':
            {
                return get_ubjson_high_precision_number();
            }

            case 'C':  // char
            {
                get();
                if (JSON_HEDLEY_UNLIKELY(!unexpect_eof(input_format_t::ubjson, "char")))
                {
                    return false;
                }
                if (JSON_HEDLEY_UNLIKELY(current > 127))
                {
                    auto last_token = get_token_string();
                    return sax->parse_error(chars_read, last_token, parse_error::create(113, chars_read, exception_message(input_format_t::ubjson, "byte after 'C' must be in range 0x00..0x7F; last byte: 0x" + last_token, "char")));
                }
                string_t s(1, static_cast<typename string_t::value_type>(current));
                return sax->string(s);
            }

            case 'S':  // string
            {
                string_t s;
                return get_ubjson_string(s) && sax->string(s);
            }

            case '[':  // array
                return get_ubjson_array();

            case '{':  // object
                return get_ubjson_object();

            default: // anything else
            {
                auto last_token = get_token_string();
                return sax->parse_error(chars_read, last_token, parse_error::create(112, chars_read, exception_message(input_format_t::ubjson, "invalid byte: 0x" + last_token, "value")));
            }
        }
    }